

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O0

void uv_loop_delete(uv_loop_t *loop)

{
  uv_loop_t *in_RDI;
  
  uv__loop_delete((uv_loop_t *)0x111e2e);
  memset(in_RDI,0xff,0x2d0);
  if (in_RDI == default_loop_ptr) {
    default_loop_ptr = (uv_loop_t *)0x0;
  }
  else {
    free(in_RDI);
  }
  return;
}

Assistant:

void uv_loop_delete(uv_loop_t* loop) {
  uv__loop_delete(loop);
#ifndef NDEBUG
  memset(loop, -1, sizeof(*loop));
#endif
  if (loop == default_loop_ptr)
    default_loop_ptr = NULL;
  else
    free(loop);
}